

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2FullMatchZeroArg(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_288;
  RE2 local_f8;
  StringPiece local_18;
  
  StringPiece::StringPiece(&local_18,"1001");
  RE2::RE2(&local_f8,"\\d+");
  bVar1 = RE2::FullMatch<>(&local_18,&local_f8);
  RE2::~RE2(&local_f8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x26a);
    poVar2 = LogMessage::stream(&local_288);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"1001\", \"\\\\d+\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_288);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchZeroArg) {
  // Zero-arg
  CHECK(RE2::FullMatch("1001", "\\d+"));
}